

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::DefaultExpression::Copy(DefaultExpression *this)

{
  tuple<duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_> this_00;
  pointer pDVar1;
  long in_RSI;
  templated_unique_single_t copy;
  __uniq_ptr_impl<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>
  .super__Head_base<0UL,_duckdb::DefaultExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>
        )operator_new(0x38);
  DefaultExpression((DefaultExpression *)
                    this_00.
                    super__Tuple_impl<0UL,_duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>
                    .super__Head_base<0UL,_duckdb::DefaultExpression_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>
  .super__Head_base<0UL,_duckdb::DefaultExpression_*,_false>._M_head_impl =
       (tuple<duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>)
       (tuple<duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>
       .super__Head_base<0UL,_duckdb::DefaultExpression_*,_false>._M_head_impl;
  pDVar1 = unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>,_true>
           ::operator->((unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>,_true>
                         *)&local_20);
  (pDVar1->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pDVar1->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pDVar1->super_ParsedExpression).super_BaseExpression.alias);
  (pDVar1->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::DefaultExpression_*,_std::default_delete<duckdb::DefaultExpression>_>
       .super__Head_base<0UL,_duckdb::DefaultExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> DefaultExpression::Copy() const {
	auto copy = make_uniq<DefaultExpression>();
	copy->CopyProperties(*this);
	return std::move(copy);
}